

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ArenaStringPtr::Set<>(ArenaStringPtr *this,string *value,Arena *arena)

{
  void *pvVar1;
  pointer pcVar2;
  Arena *arena_00;
  TaggedStringPtr TVar3;
  undefined8 extraout_RAX;
  char *in_RCX;
  string *unaff_R14;
  string_view s;
  ArenaStringPtr local_30 [2];
  
  pvVar1 = (this->tagged_ptr_).ptr_;
  if (((ulong)pvVar1 & 3) != 0) {
    if (((ulong)pvVar1 & 2) == 0) {
      Set<>(local_30);
    }
    else if ((string *)((ulong)pvVar1 & 0xfffffffffffffffc) != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)((ulong)pvVar1 & 0xfffffffffffffffc));
      return;
    }
    Set<>(local_30);
LAB_00379e19:
    Set<>();
    operator_delete(unaff_R14,0x20);
    _Unwind_Resume(extraout_RAX);
  }
  pcVar2 = (value->_M_dataplus)._M_p;
  arena_00 = (Arena *)value->_M_string_length;
  if (arena == (Arena *)0x0) {
    unaff_R14 = (string *)operator_new(0x20);
    *(string **)unaff_R14 = unaff_R14 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              (unaff_R14,pcVar2,pcVar2 + (long)&(arena_00->impl_).tag_and_id_);
    if (((ulong)unaff_R14 & 3) != 0) goto LAB_00379e19;
    TVar3.ptr_ = (void *)((ulong)unaff_R14 | 2);
  }
  else {
    s._M_str = in_RCX;
    s._M_len = (size_t)pcVar2;
    TVar3 = anon_unknown_8::CreateArenaString((anon_unknown_8 *)arena,arena_00,s);
  }
  (this->tagged_ptr_).ptr_ = TVar3.ptr_;
  return;
}

Assistant:

void ArenaStringPtr::Set(const std::string& value, Arena* arena) {
  ScopedCheckPtrInvariants check(&tagged_ptr_);
  if (IsDefault()) {
    // If we're not on an arena, skip straight to a true string to avoid
    // possible copy cost later.
    tagged_ptr_ = arena != nullptr ? CreateArenaString(*arena, value)
                                   : CreateString(value);
  } else {
    if (internal::DebugHardenForceCopyDefaultString()) {
      if (arena == nullptr) {
        auto* old = tagged_ptr_.GetIfAllocated();
        tagged_ptr_ = CreateString(value);
        delete old;
      } else {
        auto* old = UnsafeMutablePointer();
        tagged_ptr_ = CreateArenaString(*arena, value);
        old->assign("garbagedata");
      }
    } else {
      UnsafeMutablePointer()->assign(value);
    }
  }
}